

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O2

void __thiscall TTD::SnapshotExtractor::UnloadDataFromExtractor(SnapshotExtractor *this)

{
  MarkTable::Clear(&this->m_marks);
  DList<Js::RecyclableObject_*,_Memory::HeapAllocator,_RealCount>::Clear(&(this->m_worklist).list);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapHandler_*>::Unload
            (&this->m_idToHandlerMap);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapType::SnapType_*>::Unload(&this->m_idToTypeMap);
  this->m_pendingSnap = (SnapShot *)0x0;
  return;
}

Assistant:

void SnapshotExtractor::UnloadDataFromExtractor()
    {
        this->m_marks.Clear();
        this->m_worklist.Clear();

        this->m_idToHandlerMap.Unload();
        this->m_idToTypeMap.Unload();

        this->m_pendingSnap = nullptr;
    }